

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_max.h
# Opt level: O0

void __thiscall
mp::
MinOrMaxConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,1>
::
ConvertNonConvexPart<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>
          (MinOrMaxConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_1>
           *this,CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>
                 *mc)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar1;
  const_reference pvVar2;
  FunctionalConstraint *in_RSI;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  NodeRange NVar3;
  NodeRange NVar4;
  size_t i;
  int resvar;
  vector<int,_std::allocator<int>_> flags;
  size_t nargs;
  Arguments *args;
  NodeIndexRange in_stack_fffffffffffffb80;
  ValueNode *in_stack_fffffffffffffb88;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_fffffffffffffb90;
  size_type in_stack_fffffffffffffb98;
  undefined1 uVar5;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  value_type vVar6;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *in_stack_fffffffffffffba8;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *con;
  AlgConRhs<1> in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbd8;
  Type type;
  ValueNode *in_stack_fffffffffffffbe0;
  NodeIndexRange in_stack_fffffffffffffbe8;
  NodeRange NVar7;
  AlgConRhs<_1> in_stack_fffffffffffffbf0;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffbf8;
  int local_400;
  value_type local_3fc;
  int *local_3f8;
  undefined8 local_3f0;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> local_3c9 [2];
  ulong local_1b0;
  int local_1a4;
  NodeRange local_1a0;
  AlgConRhs<1> local_190 [4];
  undefined8 local_170;
  vector<int,_std::allocator<int>_> local_38;
  size_type local_20;
  Arguments *local_18;
  FunctionalConstraint *local_10;
  
  type = (Type)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
  local_10 = in_RSI;
  local_18 = CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
             ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
                             *)(in_RSI + 1));
  local_20 = std::vector<int,_std::allocator<int>_>::size(local_18);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AddVars_returnIds(in_stack_fffffffffffffbf8,(size_t)in_stack_fffffffffffffbf0.rhs_,
                      (double)in_stack_fffffffffffffbe8,(double)in_stack_fffffffffffffbe0,type);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  local_170 = 0x3ff0000000000000;
  std::allocator<double>::allocator((allocator<double> *)0x1f6aa4);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
             ,(value_type_conflict *)in_stack_fffffffffffffb90,
             (allocator_type *)in_stack_fffffffffffffb88);
  uVar5 = (undefined1)(in_stack_fffffffffffffb98 >> 0x38);
  LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffffbf0.rhs_,
                     (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbe8,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbe0);
  AlgConRhs<1>::AlgConRhs(local_190,1.0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            (in_stack_fffffffffffffba8,
             (LinTerms *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
             in_stack_fffffffffffffbb0,(bool)uVar5);
  NVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)in_stack_fffffffffffffbb0.rhs_,in_stack_fffffffffffffba8);
  local_1a0 = NVar3;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)in_stack_fffffffffffffb80);
  LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffffb80);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90);
  std::allocator<double>::~allocator((allocator<double> *)0x1f6b8c);
  local_1a4 = FunctionalConstraint::GetResultVar(local_10);
  NVar7.ir_ = in_stack_fffffffffffffbe8;
  NVar7.pvn_ = in_stack_fffffffffffffbe0;
  NVar4.ir_ = in_stack_fffffffffffffb80;
  NVar4.pvn_ = in_stack_fffffffffffffb88;
  for (local_1b0 = 0; local_1b0 < local_20; local_1b0 = local_1b0 + 1) {
    pFVar1 = BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             ::GetMC(in_RDI);
    uVar5 = (undefined1)((ulong)pFVar1 >> 0x38);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,local_1b0);
    vVar6 = *pvVar2;
    local_3c9[0].super_BasicConstraint.name_._1_8_ = 0x3ff0000000000000;
    local_3c9[0].super_BasicConstraint.name_._9_8_ = 0xbff0000000000000;
    local_3c9[0].super_BasicConstraint.name_.field_2._1_8_ =
         &local_3c9[0].super_BasicConstraint.name_.field_0x1;
    local_3c9[0]._25_8_ = 2;
    con = local_3c9;
    std::allocator<double>::allocator((allocator<double> *)0x1f6c3e);
    __l._M_len = (size_type)in_RDI;
    __l._M_array = (iterator)NVar3.pvn_;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)NVar3.ir_,__l,(allocator_type *)con);
    local_400 = local_1a4;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_18,local_1b0);
    local_3fc = *pvVar2;
    local_3f8 = &local_400;
    local_3f0 = 2;
    in_stack_fffffffffffffb90 =
         (IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *)
         &stack0xfffffffffffffbff;
    std::allocator<int>::allocator((allocator<int> *)0x1f6cbc);
    __l_00._M_len = (size_type)in_RDI;
    __l_00._M_array = (iterator)NVar3.pvn_;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)NVar3.ir_,__l_00,(allocator_type *)con);
    LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffffbf0.rhs_,
                       (vector<double,_std::allocator<double>_> *)NVar7.ir_,
                       (vector<int,_std::allocator<int>_> *)NVar7.pvn_);
    AlgConRhs<-1>::AlgConRhs((AlgConRhs<_1> *)&stack0xfffffffffffffbf0,0.0);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)con,
               (LinTerms *)CONCAT44(vVar6,in_stack_fffffffffffffba0),(AlgConRhs<_1>)NVar3.ir_,
               (bool)uVar5);
    IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
    IndicatorConstraint(in_stack_fffffffffffffb90,NVar4.pvn_._4_4_,(int)NVar4.pvn_,
                        (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)NVar4.ir_);
    NVar4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
            ::
            AddConstraint<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>
                      ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        *)NVar3.ir_,con);
    NVar7 = NVar4;
    IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
    ~IndicatorConstraint
              ((IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *)
               NVar4.ir_);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
              ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)NVar4.ir_);
    LinTerms::~LinTerms((LinTerms *)NVar4.ir_);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb90);
    std::allocator<int>::~allocator((allocator<int> *)0x1f6dc1);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90);
    std::allocator<double>::~allocator((allocator<double> *)0x1f6ddb);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb90);
  return;
}

Assistant:

void ConvertNonConvexPart(const MinOrMaxConstraint& mc) {
    const auto& args = mc.GetArguments();
    const std::size_t nargs = args.size();
    const auto flags =                            // binary flags
        GetMC().AddVars_returnIds(nargs, 0.0, 1.0, var::Type::INTEGER);
    GetMC().AddConstraint(LinConGE(               // sum of the flags >= 1
               { std::vector<double>(nargs, 1.0),
                                   flags }, 1.0));
    const auto resvar = mc.GetResultVar();
    for (size_t i=0; i<nargs; ++i) {
      GetMC().AddConstraint(
                     IndicatorConstraintLinLE{flags[i], 1,
                         { { {1.0*sense, -1.0*sense},
                             {resvar, args[i]} }, 0.0 }});
    }
  }